

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits>::match
          (Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *this,string_ref item)

{
  string_ref str;
  bool bVar1;
  Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *in_RDX;
  char *in_RSI;
  vector<char,_std::allocator<char>_> *in_RDI;
  Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *unaff_retaddr;
  Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *in_stack_00000040;
  Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *in_stack_00000068;
  Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *in_stack_00000088;
  vector<char,_std::allocator<char>_> *chars;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  chars = in_RDI;
  std::vector<char,_std::allocator<char>_>::clear((vector<char,_std::allocator<char>_> *)0x1a5945);
  str.len_ = (size_t)in_RDX;
  str.ptr_ = in_RSI;
  decode_to<cpsm::SimpleStringTraits>(str,chars);
  bVar1 = scan((Matcher<cpsm::PlatformPathTraits,_cpsm::SimpleStringTraits> *)
               CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  if (bVar1) {
    bVar1 = check_crfile(in_stack_00000068);
    if (bVar1) {
      *(undefined4 *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl = 0;
      in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x4 = 0;
      *(undefined8 *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 =
           0;
      *(undefined8 *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 =
           0;
      *(undefined8 *)&in_RDI[5].super__Vector_base<char,_std::allocator<char>_>._M_impl = 0;
      bVar1 = std::vector<char,_std::allocator<char>_>::empty(chars);
      if ((!bVar1) && (bVar1 = std::vector<char,_std::allocator<char>_>::empty(chars), !bVar1)) {
        make_item_matchcase(in_RDX);
        bVar1 = check_component_match_front(this);
        if (!bVar1) {
          return true;
        }
        bVar1 = check_basename_match_word_prefix(in_stack_00000088);
        if (bVar1) {
          score_basename_word_prefix_match(in_stack_00000040);
        }
        else {
          score_basename_greedy(unaff_retaddr);
        }
        return true;
      }
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool match(boost::string_ref const item) {
    item_.clear();
    decode_to<StringTraits>(item, item_);

    // Determine if the query matches at all.
    if (!scan()) {
      return false;
    }

    // Check for compatibility with `crfile`.
    if (!check_crfile()) {
      return false;
    }

    // Beyond this point, the item is definitely a match, and we're only
    // evaluating its quality. Reset scoring state (other than what's already
    // been assigned by `check_crfile`).
    prefix_level_ = PrefixLevel::NONE;
    whole_basename_match_ = false;
    basename_longest_submatch_ = 0;
    basename_match_count_ = 0;
    basename_word_gaps_ = 0;

    // Don't waste any time on empty queries, which can't do any further
    // differentiation between items. Also return early if the item is empty,
    // so that the remainder of the algorithm can assume it isn't.
    if (query_.empty() || item_.empty()) {
      return true;
    }

    // If the match is case-insensitive, the query must not contain any
    // uppercase letters. Convert all uppercase characters in the item to
    // lowercase so matching below this point is simply equality comparison.
    make_item_matchcase();

    // Try to constrain the match so that matches are required at the start of
    // matched path components.
    if (!check_component_match_front()) {
      // If that fails, conclude that the match is bad and don't do any further
      // matching.
      return true;
    }

    // Try to additionally constrain the match so that all matches in the
    // basename (rightmost path component) occur at the beginning of "words".
    if (check_basename_match_word_prefix()) {
      score_basename_word_prefix_match();
    } else {
      // If that fails, fall back to simple greedy matching.
      score_basename_greedy();
    }

    return true;
  }